

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O0

void __thiscall TargetImageWidget::LoadImage(TargetImageWidget *this,QString *fileName)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  QFlag local_74;
  QFlags<QMessageBox::StandardButton> local_70 [4];
  QString local_60;
  QString local_48;
  int local_2c;
  int response;
  QSize local_20;
  QString *local_18;
  QString *fileName_local;
  TargetImageWidget *this_local;
  
  local_18 = fileName;
  fileName_local = (QString *)this;
  uVar3 = QImage::load((QString *)&this->image_,(char *)fileName);
  if ((uVar3 & 1) != 0) {
    PanAndZoomWidget::ResetView(&this->super_PanAndZoomWidget);
    onResetTranslationRequested(this);
    onFitToTargetRequested(this);
    local_20 = (QSize)QImage::size();
    QSize::QSize((QSize *)&stack0xffffffffffffffd8,0x1000,0x1000);
    bVar1 = operator==(&local_20,(QSize *)&stack0xffffffffffffffd8);
    if (bVar1) {
      QString::QString(&local_48,"Skip modification?");
      QString::QString(&local_60,
                       "This image is already 4096 * 4096 pixels, would you like to set this as the target image directly?"
                      );
      QFlag::QFlag(&local_74,0x14000);
      QFlags<QMessageBox::StandardButton>::QFlags(local_70,local_74);
      iVar2 = QMessageBox::question
                        ((QWidget *)this,&local_48,&local_60,
                         (QFlags_conflict1 *)(ulong)(uint)local_70[0].i,NoButton);
      QString::~QString(&local_60);
      QString::~QString(&local_48);
      if (iVar2 == 0x4000) {
        local_2c = iVar2;
        onUseWholeImageRequested(this);
      }
    }
  }
  return;
}

Assistant:

void TargetImageWidget::LoadImage(QString fileName)
{
    if (image_.load(fileName)) {
        ResetView();
        onResetTranslationRequested();
        onFitToTargetRequested();

        if (image_.size() == QSize(4096, 4096)) {
            int response = QMessageBox::question(this, "Skip modification?", "This image is already 4096 * 4096 pixels, would you like to set this as the target image directly?");
            if (response == QMessageBox::StandardButton::Yes) {
                emit onUseWholeImageRequested();
            }
        }
    }
}